

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorBasicData.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorBasicData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Mode5InterrogatorBasicData *this)

{
  ostream *poVar1;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KStringStream ss;
  KString KStack_248;
  KString local_228;
  ulong local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Mode 5 Interrogator Basic Data:");
  Mode5InterrogatorStatus::GetAsString_abi_cxx11_(&local_1e0,&this->m_Status);
  UTILS::IndentString(&local_1c0,&local_1e0,Tabs,in_CL);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  local_208 = (ulong)this->m_ui32MsgFormats;
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_200,(bitset<32ul> *)&local_208);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  EntityIdentifier::GetAsString_abi_cxx11_(&KStack_248,&this->m_InterrogatedID);
  UTILS::IndentString(&local_228,&KStack_248,Tabs_00,in_CL);
  std::operator<<(poVar1,(string *)&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&KStack_248);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Mode5InterrogatorBasicData::GetAsString() const
{
    KStringStream ss;	
	ss << "Mode 5 Interrogator Basic Data:"
       << IndentString( m_Status.GetAsString() )
	   << GetMessageFormatsPresentBitSet().to_string()
	   << IndentString( m_InterrogatedID.GetAsString() );	   
	   
    return ss.str();
}